

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O3

void __thiscall Num::delereZeros(Num *this,Num *number)

{
  string *psVar1;
  int iVar2;
  ushort length;
  undefined4 *puVar3;
  short sVar4;
  ulong uVar5;
  ulong uVar6;
  Byte BVar7;
  char *pcVar8;
  char *this_00;
  Num *this_01;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined8 uStack_70;
  Num *pNStack_68;
  char *pcStack_60;
  ulong uStack_58;
  string *psStack_50;
  char *pcStack_48;
  code *pcStack_40;
  
  uVar6 = (number->base)._M_string_length;
  psVar1 = &number->base;
  uVar5 = uVar6 & 0xffffffff;
  while( true ) {
    sVar4 = (short)uVar5;
    uVar9 = (uVar5 & 0xffff) - 1;
    if (((ushort)uVar9 < (ushort)uVar6) && ((psVar1->_M_dataplus)._M_p[uVar9 & 0xffff] != '0'))
    break;
    if (sVar4 == 1) {
      pcStack_40 = (code *)0x102ef1;
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) {
        uVar6 = (number->base)._M_string_length;
        break;
      }
    }
    pcStack_40 = (code *)0x102f00;
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    uVar6 = (number->base)._M_string_length;
    uVar5 = CONCAT62((int6)(uVar5 >> 0x10),sVar4 + -1);
    if ((sVar4 == 0) && (iVar2 == 0)) break;
    if (uVar6 < uVar9) {
      this_00 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
      pcVar8 = "basic_string::erase";
      pcStack_40 = operator-;
      auVar10 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase",uVar9);
      puVar3 = auVar10._8_8_;
      uStack_70 = auVar10._0_8_;
      pcStack_48 = "0";
      pcStack_60 = "";
      length = (ushort)*puVar3;
      if ((ushort)*puVar3 < (ushort)*(undefined4 *)pcVar8) {
        length = (ushort)*(undefined4 *)pcVar8;
      }
      this_01 = (Num *)this_00;
      pNStack_68 = number;
      uStack_58 = uVar9;
      psStack_50 = psVar1;
      pcStack_40 = (code *)uVar5;
      Num((Num *)this_00,length,0);
      uStack_70 = uStack_70 & 0xffffffff;
      if (length != 0) {
        uVar6 = 0;
        do {
          this_01 = (Num *)0x0;
          if (uVar6 < *(ushort *)(pcVar8 + 0x10)) {
            this_01 = (Num *)(ulong)((int)*(char *)(*(long *)(pcVar8 + 8) + uVar6) - 0x30);
          }
          BVar7 = 0;
          if (uVar6 < *(ushort *)(puVar3 + 4)) {
            BVar7 = (int)*(char *)(*(long *)(puVar3 + 2) + uVar6) - 0x30;
          }
          BVar7 = Multiplicator::baseSubstraction
                            ((Byte)this_01,BVar7,(Byte *)((long)&uStack_70 + 4));
          ((Num *)this_00)->size = (Short)uVar6;
          (((Num *)this_00)->base)._M_dataplus._M_p[uVar6] = (char)BVar7 + '0';
          uVar6 = uVar6 + 1;
        } while (length != uVar6);
      }
      delereZeros(this_01,(Num *)this_00);
      return;
    }
    (number->base)._M_string_length = uVar9;
    (number->base)._M_dataplus._M_p[uVar9] = '\0';
    uVar6 = (number->base)._M_string_length;
  }
  number->size = (Short)uVar6;
  return;
}

Assistant:

void Num::delereZeros(Num& number) // delete insignificant zeros
{
    Num::Short k = number.getSize();
    while (number.getDigit(k - 1) == 0)
    {
        if ((k == 1 && number.base == "0") || (number.base == "" && k == 0))
            break;
        number.base.erase(k - 1);
        --k;
    }
    number.size = number.base.size();
}